

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void RPCRunLater(string *name,function<void_()> func,int64_t nSeconds)

{
  string_view source_file;
  bool bVar1;
  int iVar2;
  Logger *pLVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UniValue *__return_storage_ptr__;
  pointer in_RDX;
  char **in_R9;
  long in_FS_OFFSET;
  string_view str;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>_>
  pVar4;
  string_view logging_function;
  UniqueLock<GlobalMutex> criticalblock10;
  string log_msg;
  long local_100;
  undefined1 local_f8 [16];
  unique_lock<std::mutex> local_e8 [5];
  undefined8 local_98;
  char *pcStack_90;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (timerInterface == (RPCTimerInterface *)0x0) {
    __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"No timer handler registered for RPC","");
    JSONRPCError(__return_storage_ptr__,-0x7f5b,&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    local_e8[0]._M_device = (mutex_type *)&g_deadline_timers_mutex;
    local_e8[0]._M_owns = false;
    local_f8._0_8_ = in_RDX;
    std::unique_lock<std::mutex>::lock(local_e8);
    pVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>_>
            ::equal_range(&deadlineTimers_abi_cxx11_._M_t,name);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>_>
    ::_M_erase_aux(&deadlineTimers_abi_cxx11_._M_t,(_Base_ptr)pVar4.first._M_node,
                   (_Base_ptr)pVar4.second._M_node);
    pLVar3 = LogInstance();
    bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar3,RPC,Debug);
    if (bVar1) {
      iVar2 = (*timerInterface->_vptr_RPCTimerInterface[2])();
      local_100 = CONCAT44(extraout_var,iVar2);
      pLVar3 = LogInstance();
      bVar1 = BCLog::Logger::Enabled(pLVar3);
      if (bVar1) {
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        tinyformat::format<std::__cxx11::string,long,char_const*>
                  (&local_78,(tinyformat *)"queue run of timer %s in %i seconds (using %s)\n",
                   (char *)name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   &local_100,in_R9);
        RPCRunLater();
        pLVar3 = LogInstance();
        local_98 = 0x57;
        pcStack_90 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.cpp";
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.cpp"
        ;
        source_file._M_len = 0x57;
        str._M_str = local_58._M_dataplus._M_p;
        str._M_len = local_58._M_string_length;
        logging_function._M_str = "RPCRunLater";
        logging_function._M_len = 0xb;
        BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x24a,RPC,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
      }
    }
    iVar2 = (*timerInterface->_vptr_RPCTimerInterface[3])
                      (timerInterface,nSeconds,local_f8._0_8_ * 1000);
    local_58._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_00,iVar2);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>>>
    ::
    _M_emplace_unique<std::__cxx11::string_const&,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>>>
                *)&deadlineTimers_abi_cxx11_,name,
               (unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_> *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_58._M_dataplus._M_p + 8))();
    }
    std::unique_lock<std::mutex>::~unique_lock(local_e8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void RPCRunLater(const std::string& name, std::function<void()> func, int64_t nSeconds)
{
    if (!timerInterface)
        throw JSONRPCError(RPC_INTERNAL_ERROR, "No timer handler registered for RPC");
    LOCK(g_deadline_timers_mutex);
    deadlineTimers.erase(name);
    LogDebug(BCLog::RPC, "queue run of timer %s in %i seconds (using %s)\n", name, nSeconds, timerInterface->Name());
    deadlineTimers.emplace(name, std::unique_ptr<RPCTimerBase>(timerInterface->NewTimer(func, nSeconds*1000)));
}